

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
                    *this,Index target,Index source)

{
  uint uVar1;
  pointer pIVar2;
  undefined1 *puVar3;
  Zp_field_operators<unsigned_int,_void> *this_00;
  node_ptr plVar4;
  int iVar5;
  uint uVar6;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  *targetColumn;
  uint local_30;
  Index local_2c;
  
  pIVar2 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined1 **)&pIVar2[source].column_.super_type.data_.root_plus_size_;
  uVar6 = 0;
  if ((Column_support *)puVar3 != &pIVar2[source].column_ && puVar3 != (undefined1 *)0x0) {
    uVar6 = *(uint *)((long)&pIVar2[source].column_.super_type.data_.root_plus_size_.m_header.
                             super_node.prev_[-1].prev_ + 4);
  }
  targetColumn = pIVar2 + target;
  this_00 = this->operators_;
  uVar1 = this_00->characteristic_;
  if (uVar1 <= uVar6) {
    uVar6 = uVar6 % uVar1;
  }
  local_30 = (this_00->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar6];
  plVar4 = (targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar5 = 0;
  if (plVar4 != (node_ptr)&targetColumn->column_ && plVar4 != (node_ptr)0x0) {
    iVar5 = *(int *)((long)&(targetColumn->column_).super_type.data_.root_plus_size_.m_header.
                            super_node.prev_[-1].prev_ + 4);
  }
  local_2c = source;
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (this_00,&local_30,uVar1 - iVar5);
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
            (&local_30,pIVar2 + source,targetColumn);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  ::multiply_source_and_add_to<unsigned_int>(&this->mirrorMatrixU_,&local_30,&local_2c,target);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}